

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O2

attack * getmattk(permonst *mptr,int indx,int *prev_result,attack *alt_attk_buf)

{
  byte bVar1;
  
  if ((0 < indx) && (0 < prev_result[indx - 1U])) {
    bVar1 = mptr->mattk[indx].adtyp;
    if (((ulong)bVar1 < 0x28) &&
       (((0xc200000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0 &&
        (bVar1 == mptr->mattk[indx - 1U].adtyp)))) {
      *alt_attk_buf = mptr->mattk[indx];
      alt_attk_buf->adtyp = '\f';
      return alt_attk_buf;
    }
  }
  return mptr->mattk + indx;
}

Assistant:

const struct attack *getmattk(const struct permonst *mptr, int indx, int prev_result[],
			struct attack *alt_attk_buf)
{
    const struct attack *attk = &mptr->mattk[indx];

    /* prevent a monster with two consecutive disease or hunger attacks
       from hitting with both of them on the same turn; if the first has
       already hit, switch to a stun attack for the second */
    if (indx > 0 && prev_result[indx - 1] > 0 &&
	    (attk->adtyp == AD_DISE ||
		attk->adtyp == AD_PEST ||
		attk->adtyp == AD_FAMN) &&
	    attk->adtyp == mptr->mattk[indx - 1].adtyp) {
	*alt_attk_buf = *attk;
	alt_attk_buf->adtyp = AD_STUN;
	attk = alt_attk_buf;
    }
    return attk;
}